

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrVertexAttrib.cpp
# Opt level: O0

void rr::(anonymous_namespace)::
     readOrder<unsigned_short,float,rr::(anonymous_namespace)::NormalOrder>
               (Vector<float,_4> *dst,int size,void *ptr)

{
  float *pfVar1;
  ushort local_28;
  ushort local_26;
  ushort local_24;
  ushort local_22;
  unsigned_short aligned [4];
  void *ptr_local;
  int size_local;
  Vector<float,_4> *dst_local;
  
  aligned = (unsigned_short  [4])ptr;
  deMemcpy(&local_28,ptr,(long)size * 2);
  pfVar1 = tcu::Vector<float,_4>::operator[](dst,0);
  *pfVar1 = (float)local_28;
  if (1 < size) {
    pfVar1 = tcu::Vector<float,_4>::operator[](dst,1);
    *pfVar1 = (float)local_26;
  }
  if (2 < size) {
    pfVar1 = tcu::Vector<float,_4>::operator[](dst,2);
    *pfVar1 = (float)local_24;
  }
  if (3 < size) {
    pfVar1 = tcu::Vector<float,_4>::operator[](dst,3);
    *pfVar1 = (float)local_22;
  }
  return;
}

Assistant:

inline void readOrder (typename tcu::Vector<DstScalarType, 4>& dst, const int size, const void* ptr)
{
	SrcScalarType aligned[4];
	deMemcpy(aligned, ptr, size * sizeof(SrcScalarType));

				   dst[Order::T0] = DstScalarType(aligned[0]);
	if (size >= 2) dst[Order::T1] = DstScalarType(aligned[1]);
	if (size >= 3) dst[Order::T2] = DstScalarType(aligned[2]);
	if (size >= 4) dst[Order::T3] = DstScalarType(aligned[3]);
}